

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O2

void deqp::gles3::Functional::textureLevelsTest(TestContext *testCtx,Context *context)

{
  GLenum expect;
  int iVar1;
  uint uVar2;
  int ndx;
  long lVar3;
  GLint maxTexSize;
  TestContext *local_1c0;
  undefined1 local_1b8 [8];
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined8 local_1a8;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  undefined4 local_18c;
  
  local_1c0 = testCtx;
  (*context->_vptr_Context[0x7b])(context,0xd33,&maxTexSize);
  if (maxTexSize == 0) {
    uVar2 = 0x20;
  }
  else {
    uVar2 = 0x1f;
    if (maxTexSize != 0) {
      for (; (uint)maxTexSize >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  local_1b8 = (undefined1  [8])local_1c0->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  std::operator<<((ostream *)&uStack_1b0,"// GL_MAX_TEXTURE_SIZE is ");
  std::ostream::operator<<((ostringstream *)&uStack_1b0,maxTexSize);
  std::operator<<((ostream *)&uStack_1b0,", floor(log2(");
  std::ostream::operator<<((ostringstream *)&uStack_1b0,maxTexSize);
  std::operator<<((ostream *)&uStack_1b0,")) = ");
  iVar1 = 0x1f - uVar2;
  std::ostream::operator<<((ostringstream *)&uStack_1b0,iVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x7e])(context,0xde1,0,0x1907,0x100,0x100);
  (*context->_vptr_Context[0x7e])(context,0xde1,1,0x1907,0x80,0x80);
  (*context->_vptr_Context[9])(context,0x8d40,1);
  local_1b8 = (undefined1  [8])0x100000002;
  uStack_1b0 = 0;
  uStack_1ac = 0xffffffff;
  local_1a8 = 0x7fffffff;
  local_1a0 = 0x1d - uVar2;
  local_19c = 0x1e - uVar2;
  local_198 = iVar1;
  local_194 = 0x20 - uVar2;
  local_190 = 0x21 - uVar2;
  local_18c = 1;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 1) {
    uVar2 = *(uint *)(local_1b8 + lVar3 * 4);
    (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,1,(ulong)uVar2);
    expect = 0;
    if (iVar1 < (int)uVar2) {
      expect = 0x501;
    }
    if ((int)uVar2 < 0) {
      expect = 0x501;
    }
    checkError(local_1c0,context,expect);
  }
  return;
}

Assistant:

static void textureLevelsTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	deUint32	tex		= 1;
	deUint32	fbo		= 1;
	GLint		maxTexSize;
	int			log2MaxTexSize;

	context.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);
	log2MaxTexSize = deLog2Floor32(maxTexSize);

	testCtx.getLog() << TestLog::Message << "// GL_MAX_TEXTURE_SIZE is " << maxTexSize << ", floor(log2(" << maxTexSize << ")) = " << log2MaxTexSize << TestLog::EndMessage;

	context.bindTexture(GL_TEXTURE_2D, tex);
	context.texImage2D(GL_TEXTURE_2D, 0, GL_RGB, 256, 256);
	context.texImage2D(GL_TEXTURE_2D, 1, GL_RGB, 128, 128);

	context.bindFramebuffer(GL_FRAMEBUFFER, fbo);

	const int levels[] = { 2, 1, 0, -1, 0x7fffffff, 0, log2MaxTexSize-2, log2MaxTexSize-1, log2MaxTexSize, log2MaxTexSize+1, log2MaxTexSize+2, 1 };

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(levels); ndx++)
	{
		context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, levels[ndx]);
		checkError(testCtx, context, levels[ndx] >= 0 && levels[ndx] <= log2MaxTexSize ? GL_NO_ERROR : GL_INVALID_VALUE);
	}
}